

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

TokenOrSyntax * __thiscall
slang::syntax::TimingControlStatementSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,TimingControlStatementSyntax *this,size_t index)

{
  StatementSyntax *pSVar1;
  char *func;
  Token local_20;
  
  switch(index) {
  case 0:
    pSVar1 = (StatementSyntax *)(this->super_StatementSyntax).label;
    break;
  case 1:
    *(SyntaxNode **)
     &(__return_storage_ptr__->super_ConstTokenOrSyntax).
      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
         &(this->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode;
    goto LAB_002e1c25;
  case 2:
    pSVar1 = (StatementSyntax *)(this->timingControl).ptr;
    if (pSVar1 == (StatementSyntax *)0x0) {
      func = 
      "T slang::not_null<slang::syntax::TimingControlSyntax *>::get() const [T = slang::syntax::TimingControlSyntax *]"
      ;
LAB_002e1c63:
      assert::assertFailed
                ("ptr",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                 ,0x26,func);
    }
    break;
  case 3:
    pSVar1 = (this->statement).ptr;
    if (pSVar1 == (StatementSyntax *)0x0) {
      func = 
      "T slang::not_null<slang::syntax::StatementSyntax *>::get() const [T = slang::syntax::StatementSyntax *]"
      ;
      goto LAB_002e1c63;
    }
    break;
  default:
    parsing::Token::Token(&local_20);
    *(undefined8 *)
     &(__return_storage_ptr__->super_ConstTokenOrSyntax).
      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
         local_20._0_8_;
    *(Info **)((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
                      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                      .
                      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                      .
                      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                      .
                      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
              + 8) = local_20.info;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
             super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 0x10
     ) = '\0';
    return __return_storage_ptr__;
  }
  *(StatementSyntax **)
   &(__return_storage_ptr__->super_ConstTokenOrSyntax).
    super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> = pSVar1;
LAB_002e1c25:
  *(__index_type *)
   ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 0x10)
       = '\x01';
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax TimingControlStatementSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return label;
        case 1: return &attributes;
        case 2: return timingControl.get();
        case 3: return statement.get();
        default: return nullptr;
    }
}